

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_mp3.h
# Opt level: O3

drmp3_uint32
drmp3_decode_next_frame_ex(drmp3 *pMP3,drmp3d_sample_t *pPCMFrames,drmp3_bool32 discard)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  drmp3_uint32 dVar4;
  drmp3_uint8 *pdVar5;
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  size_t sVar9;
  size_t __n;
  long lVar10;
  drmp3dec_frame_info info;
  drmp3dec_frame_info local_44;
  
  dVar4 = 0;
  if ((pMP3->field_0x52d0 & 1) == 0) {
    while( true ) {
      uVar8 = pMP3->dataSize;
      if (uVar8 < 0x4000) {
        uVar7 = pMP3->dataCapacity;
        pdVar5 = pMP3->pData;
        if (uVar7 < 0x4000) {
          pMP3->dataCapacity = 0x4000;
          pdVar5 = (drmp3_uint8 *)realloc(pdVar5,0x4000);
          if (pdVar5 == (drmp3_uint8 *)0x0) {
            return 0;
          }
          pMP3->pData = pdVar5;
          uVar8 = pMP3->dataSize;
          uVar7 = pMP3->dataCapacity;
        }
        sVar6 = (*pMP3->onRead)(pMP3->pUserData,pdVar5 + uVar8,uVar7 - uVar8);
        pMP3->streamCursor = pMP3->streamCursor + sVar6;
        if (sVar6 == 0 && pMP3->dataSize == 0) goto LAB_0010876d;
        uVar8 = pMP3->dataSize + sVar6;
        pMP3->dataSize = uVar8;
      }
      if (uVar8 >> 0x1f != 0) goto LAB_0010876d;
      iVar3 = drmp3dec_decode_frame(&pMP3->decoder,pMP3->pData,(int)uVar8,pPCMFrames,&local_44);
      iVar2 = local_44.frame_bytes;
      lVar10 = (long)local_44.frame_bytes;
      if (0 < lVar10) {
        __n = pMP3->dataSize - lVar10;
        memmove(pMP3->pData,pMP3->pData + lVar10,__n);
        pMP3->dataSize = __n;
      }
      if ((iVar3 != 0) || (discard != 0 && 0 < iVar2)) break;
      if (iVar2 == 0) {
        sVar6 = pMP3->dataSize;
        sVar9 = pMP3->dataCapacity;
        pdVar5 = pMP3->pData;
        if (sVar9 == sVar6) {
          pMP3->dataCapacity = sVar9 + 0x4000;
          pdVar5 = (drmp3_uint8 *)realloc(pdVar5,sVar9 + 0x4000);
          if (pdVar5 == (drmp3_uint8 *)0x0) {
            return 0;
          }
          pMP3->pData = pdVar5;
          sVar6 = pMP3->dataSize;
          sVar9 = pMP3->dataCapacity;
        }
        sVar6 = (*pMP3->onRead)(pMP3->pUserData,pdVar5 + sVar6,sVar9 - sVar6);
        pMP3->streamCursor = pMP3->streamCursor + sVar6;
        if (sVar6 == 0) {
LAB_0010876d:
          pMP3->field_0x52d0 = pMP3->field_0x52d0 | 1;
          return 0;
        }
        pMP3->dataSize = pMP3->dataSize + sVar6;
      }
    }
    bVar1 = (pMP3->decoder).header[1];
    dVar4 = 0x180;
    if ((~bVar1 & 6) != 0) {
      dVar4 = 0x480 >> ((bVar1 & 0xe) == 2);
    }
    pMP3->pcmFramesConsumedInMP3Frame = 0;
    pMP3->pcmFramesRemainingInMP3Frame = dVar4;
    pMP3->mp3FrameChannels = local_44.channels;
    pMP3->mp3FrameSampleRate = local_44.hz;
    if (local_44.hz != 0) {
      (pMP3->src).config.sampleRateIn = local_44.hz;
    }
  }
  return dVar4;
}

Assistant:

static drmp3_uint32 drmp3_decode_next_frame_ex(drmp3* pMP3, drmp3d_sample_t* pPCMFrames, drmp3_bool32 discard)
{
            drmp3_assert(pMP3 != NULL);
            drmp3_assert(pMP3->onRead != NULL);

    if (pMP3->atEnd) {
        return 0;
    }

    drmp3_uint32 pcmFramesRead = 0;
    do {
        // minimp3 recommends doing data submission in 16K chunks. If we don't have at least 16K bytes available, get more.
        if (pMP3->dataSize < DRMP3_DATA_CHUNK_SIZE) {
            if (pMP3->dataCapacity < DRMP3_DATA_CHUNK_SIZE) {
                pMP3->dataCapacity = DRMP3_DATA_CHUNK_SIZE;
                drmp3_uint8* pNewData = (drmp3_uint8*)drmp3_realloc(pMP3->pData, pMP3->dataCapacity);
                if (pNewData == NULL) {
                    return 0; // Out of memory.
                }

                pMP3->pData = pNewData;
            }

            size_t bytesRead = drmp3__on_read(pMP3, pMP3->pData + pMP3->dataSize, (pMP3->dataCapacity - pMP3->dataSize));
            if (bytesRead == 0) {
                if (pMP3->dataSize == 0) {
                    pMP3->atEnd = DRMP3_TRUE;
                    return 0; // No data.
                }
            }

            pMP3->dataSize += bytesRead;
        }

        if (pMP3->dataSize > INT_MAX) {
            pMP3->atEnd = DRMP3_TRUE;
            return 0; // File too big.
        }

        drmp3dec_frame_info info;
        pcmFramesRead = drmp3dec_decode_frame(&pMP3->decoder, pMP3->pData, (int)pMP3->dataSize, pPCMFrames, &info);    // <-- Safe size_t -> int conversion thanks to the check above.

        // Consume the data.
        size_t leftoverDataSize = (pMP3->dataSize - (size_t)info.frame_bytes);
        if (info.frame_bytes > 0) {
            memmove(pMP3->pData, pMP3->pData + info.frame_bytes, leftoverDataSize);
            pMP3->dataSize = leftoverDataSize;
        }

        // pcmFramesRead will be equal to 0 if decoding failed. If it is zero and info.frame_bytes > 0 then we have successfully
        // decoded the frame. A special case is if we are wanting to discard the frame, in which case we return successfully.
        if (pcmFramesRead > 0 || (info.frame_bytes > 0 && discard)) {
            pcmFramesRead = drmp3_hdr_frame_samples(pMP3->decoder.header);
            pMP3->pcmFramesConsumedInMP3Frame = 0;
            pMP3->pcmFramesRemainingInMP3Frame = pcmFramesRead;
            pMP3->mp3FrameChannels = info.channels;
            pMP3->mp3FrameSampleRate = info.hz;
            drmp3_src_set_input_sample_rate(&pMP3->src, pMP3->mp3FrameSampleRate);
            break;
        } else if (info.frame_bytes == 0) {
            // Need more data. minimp3 recommends doing data submission in 16K chunks.
            if (pMP3->dataCapacity == pMP3->dataSize) {
                // No room. Expand.
                pMP3->dataCapacity += DRMP3_DATA_CHUNK_SIZE;
                drmp3_uint8* pNewData = (drmp3_uint8*)drmp3_realloc(pMP3->pData, pMP3->dataCapacity);
                if (pNewData == NULL) {
                    return 0; // Out of memory.
                }

                pMP3->pData = pNewData;
            }

            // Fill in a chunk.
            size_t bytesRead = drmp3__on_read(pMP3, pMP3->pData + pMP3->dataSize, (pMP3->dataCapacity - pMP3->dataSize));
            if (bytesRead == 0) {
                pMP3->atEnd = DRMP3_TRUE;
                return 0; // Error reading more data.
            }

            pMP3->dataSize += bytesRead;
        }
    } while (DRMP3_TRUE);

    return pcmFramesRead;
}